

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem_p.h
# Opt level: O2

bool qt_closestItemFirst(QGraphicsItem *item1,QGraphicsItem *item2)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsItemPrivate *this;
  QGraphicsItem *pQVar2;
  int iVar3;
  QGraphicsItem *pQVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  QGraphicsItem *pQVar8;
  QGraphicsItem *pQVar9;
  int iVar10;
  QGraphicsItem *pQVar11;
  
  pQVar1 = (item1->d_ptr).d;
  this = (item2->d_ptr).d;
  if (pQVar1->parent != this->parent) {
    iVar6 = QGraphicsItemPrivate::depth(pQVar1);
    iVar7 = QGraphicsItemPrivate::depth(this);
    pQVar8 = item1;
    iVar3 = iVar6;
    if (iVar7 <= iVar6) {
      iVar3 = iVar7;
    }
    for (; iVar10 = iVar3, iVar7 < iVar6; iVar6 = iVar6 + -1) {
      pQVar1 = (pQVar8->d_ptr).d;
      pQVar2 = pQVar1->parent;
      iVar10 = iVar6;
      if (pQVar2 == (QGraphicsItem *)0x0) break;
      if (pQVar2 == item2) {
        return (pQVar1->field_0x165 & 1) == 0;
      }
      pQVar8 = pQVar2;
    }
    iVar7 = iVar7 + 1;
    while (iVar7 = iVar7 + -1, pQVar2 = pQVar8, pQVar4 = item2, iVar10 < iVar7) {
      pQVar1 = (item2->d_ptr).d;
      pQVar9 = pQVar1->parent;
      if (pQVar9 == (QGraphicsItem *)0x0) break;
      item2 = pQVar9;
      if (pQVar9 == item1) {
        return (bool)(pQVar1->field_0x165 & 1);
      }
    }
    while ((pQVar11 = pQVar4, pQVar9 = pQVar2, item1 = pQVar8, pQVar9 != (QGraphicsItem *)0x0 &&
           (pQVar9 != pQVar11))) {
      pQVar4 = ((pQVar11->d_ptr).d)->parent;
      item2 = pQVar11;
      pQVar8 = pQVar9;
      pQVar2 = ((pQVar9->d_ptr).d)->parent;
    }
  }
  bVar5 = qt_closestLeaf(item1,item2);
  return bVar5;
}

Assistant:

inline bool qt_closestItemFirst(const QGraphicsItem *item1, const QGraphicsItem *item2)
{
    // Siblings? Just check their z-values.
    const QGraphicsItemPrivate *d1 = item1->d_ptr.data();
    const QGraphicsItemPrivate *d2 = item2->d_ptr.data();
    if (d1->parent == d2->parent)
        return qt_closestLeaf(item1, item2);

    // Find common ancestor, and each item's ancestor closest to the common
    // ancestor.
    int item1Depth = d1->depth();
    int item2Depth = d2->depth();
    const QGraphicsItem *p = item1;
    const QGraphicsItem *t1 = item1;
    while (item1Depth > item2Depth && (p = p->d_ptr->parent)) {
        if (p == item2) {
            // item2 is one of item1's ancestors; item1 is on top
            return !(t1->d_ptr->flags & QGraphicsItem::ItemStacksBehindParent);
        }
        t1 = p;
        --item1Depth;
    }
    p = item2;
    const QGraphicsItem *t2 = item2;
    while (item2Depth > item1Depth && (p = p->d_ptr->parent)) {
        if (p == item1) {
            // item1 is one of item2's ancestors; item1 is not on top
            return (t2->d_ptr->flags & QGraphicsItem::ItemStacksBehindParent);
        }
        t2 = p;
        --item2Depth;
    }

    // item1Ancestor is now at the same level as item2Ancestor, but not the same.
    const QGraphicsItem *p1 = t1;
    const QGraphicsItem *p2 = t2;
    while (t1 && t1 != t2) {
        p1 = t1;
        p2 = t2;
        t1 = t1->d_ptr->parent;
        t2 = t2->d_ptr->parent;
    }

    // in case we have a common ancestor, we compare the immediate children in the ancestor's path.
    // otherwise we compare the respective items' topLevelItems directly.
    return qt_closestLeaf(p1, p2);
}